

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

bool __thiscall
duckdb::ThreadLocalLogger::ShouldLog(ThreadLocalLogger *this,char *log_type,LogLevel log_level)

{
  NotImplementedException *this_00;
  undefined7 in_register_00000011;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)
            __cxa_allocate_exception(0x10,log_type,CONCAT71(in_register_00000011,log_level));
  ::std::__cxx11::string::string((string *)&local_38,"ThreadLocalLogger::ShouldLog",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool ThreadLocalLogger::ShouldLog(const char *log_type, LogLevel log_level) {
	throw NotImplementedException("ThreadLocalLogger::ShouldLog");
}